

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureGatherTests::init(TextureGatherTests *this,EVP_PKEY_CTX *ctx)

{
  TextureType textureType;
  ChannelOrder CVar1;
  CompareMode shadowCompareMode;
  WrapMode wrapS;
  ChannelType CVar2;
  FilterMode minFilter;
  Context *context;
  uint uVar3;
  int iVar4;
  uint uVar5;
  TestCaseGroup *pTVar6;
  TestCaseGroup *pTVar7;
  long lVar8;
  TextureGatherCase *pTVar10;
  TextureFormat textureFormat;
  TextureFormat textureFormat_00;
  char *description;
  TextureSwizzleComponent comp;
  char *name;
  long lVar11;
  long lVar12;
  long lVar13;
  GatherType gatherType;
  ulong uVar14;
  ulong uVar15;
  bool *__lhs;
  deUint32 dVar16;
  IVec3 *local_330;
  string caseName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  TestCaseGroup *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  TestCaseGroup *local_2a0;
  int local_294;
  TestCaseGroup *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  TestCaseGroup *local_268;
  TestCaseGroup *local_260;
  long local_258;
  TestCaseGroup *local_250;
  long local_248;
  long local_240;
  MaybeTextureSwizzle swizzle;
  anon_struct_24_2_3f8e1b6f textureSizes [2];
  anon_struct_16_2_3ce319a5 formats [4];
  string caseName;
  TextureFormat TVar9;
  
  formats[0].name = "rgba8";
  formats[0].format.order = RGBA;
  formats[0].format.type = UNORM_INT8;
  formats[1].name = "rgba8ui";
  formats[1].format.order = RGBA;
  formats[1].format.type = UNSIGNED_INT8;
  formats[2].name = "rgba8i";
  formats[2].format.order = RGBA;
  formats[2].format.type = SIGNED_INT8;
  formats[3].name = "depth32f";
  formats[3].format.order = D;
  formats[3].format.type = FLOAT;
  textureSizes[0].name = "size_pot";
  textureSizes[0].size.m_data[0] = 0x40;
  textureSizes[0].size.m_data[1] = 0x40;
  textureSizes[0].size.m_data[2] = 3;
  textureSizes[1].name = "size_npot";
  textureSizes[1].size.m_data[0] = 0x11;
  textureSizes[1].size.m_data[1] = 0x17;
  uVar5 = 0;
  textureSizes[1].size.m_data[2] = textureSizes[0].size.m_data[2];
  do {
    if (uVar5 == 4) {
      return uVar5;
    }
    pTVar6 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar6,(this->super_TestCaseGroup).m_context,
               &DAT_018cf820 + *(int *)(&DAT_018cf820 + (ulong)uVar5 * 4),
               &DAT_018cf830 + *(int *)(&DAT_018cf830 + (ulong)uVar5 * 4));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    for (gatherType = GATHERTYPE_BASIC; gatherType != GATHERTYPE_OFFSETS;
        gatherType = gatherType + GATHERTYPE_OFFSET) {
      if ((uVar5 != 0) != (gatherType == GATHERTYPE_BASIC)) {
        pTVar7 = pTVar6;
        if (gatherType != GATHERTYPE_BASIC) {
          pTVar7 = (TestCaseGroup *)operator_new(0x78);
          name = (char *)0x0;
          if (gatherType == GATHERTYPE_OFFSET_DYNAMIC) {
            name = "implementation_offset";
          }
          description = (char *)0x0;
          if (gatherType == GATHERTYPE_OFFSET_DYNAMIC) {
            description = "Use offsets within the implementation range";
          }
          if (gatherType == GATHERTYPE_OFFSET) {
            name = "min_required_offset";
            description = "Use offsets within GL minimum required range";
          }
          TestCaseGroup::TestCaseGroup
                    (pTVar7,(this->super_TestCaseGroup).m_context,name,description);
          if (pTVar7 != pTVar6) {
            tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pTVar7);
          }
        }
        lVar8 = 0;
        local_268 = pTVar7;
        local_260 = pTVar6;
        while (pTVar6 = local_260, lVar8 != 3) {
          textureType = (&DAT_01e584a8)[lVar8 * 4];
          local_248 = lVar8;
          if ((uVar5 == 0) || (textureType != TEXTURETYPE_CUBE)) {
            pTVar6 = (TestCaseGroup *)operator_new(0x78);
            TestCaseGroup::TestCaseGroup
                      (pTVar6,(this->super_TestCaseGroup).m_context,
                       *(char **)(&DAT_01e584a0 + lVar8 * 0x10),
                       glcts::fixed_sample_locations_values + 1);
            tcu::TestNode::addChild((TestNode *)local_268,(TestNode *)pTVar6);
            local_294 = (textureType == TEXTURETYPE_CUBE) + 1;
            lVar8 = 0;
            local_250 = pTVar6;
            while (lVar8 != 4) {
              local_258 = lVar8;
              pTVar6 = (TestCaseGroup *)operator_new(0x78);
              TestCaseGroup::TestCaseGroup
                        (pTVar6,(this->super_TestCaseGroup).m_context,formats[lVar8].name,
                         glcts::fixed_sample_locations_values + 1);
              tcu::TestNode::addChild((TestNode *)local_250,(TestNode *)pTVar6);
              for (iVar4 = 0; iVar4 != local_294; iVar4 = iVar4 + 1) {
                if (iVar4 == 0) {
                  local_330 = (IVec3 *)0x0;
                  local_290 = pTVar6;
                }
                else {
                  pTVar7 = (TestCaseGroup *)operator_new(0x78);
                  TestCaseGroup::TestCaseGroup
                            (pTVar7,(this->super_TestCaseGroup).m_context,"no_corners",
                             "Test case variants that don\'t sample around cube map corners");
                  local_290 = pTVar7;
                  if (pTVar6 != pTVar7) {
                    tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pTVar7);
                  }
                  local_330 = (IVec3 *)0x2;
                }
                lVar12 = 0;
                while (lVar12 != 2) {
                  local_240 = lVar12;
                  pTVar7 = (TestCaseGroup *)operator_new(0x78);
                  TestCaseGroup::TestCaseGroup
                            (pTVar7,(this->super_TestCaseGroup).m_context,textureSizes[lVar12].name,
                             glcts::fixed_sample_locations_values + 1);
                  local_2a0 = (TestCaseGroup *)&textureSizes[lVar12].size;
                  local_2c8 = pTVar7;
                  tcu::TestNode::addChild((TestNode *)local_290,(TestNode *)pTVar7);
                  CVar1 = formats[lVar8].format.order;
                  uVar3 = 0;
                  while( true ) {
                    TVar9.type = SNORM_INT8;
                    TVar9.order = uVar3;
                    if (uVar3 == 9) break;
                    if ((uVar3 != 0) == ((CVar1 - D & 0xfffffffd) == 0)) {
                      pTVar7 = local_2c8;
                      if (uVar3 != 0) {
                        if ((uVar3 != 3) && (uVar3 != 1)) goto LAB_0136fd67;
                        pTVar7 = (TestCaseGroup *)operator_new(0x78);
                        context = (this->super_TestCaseGroup).m_context;
                        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
                        local_2e8._M_string_length = 0;
                        local_2e8.field_2._M_local_buf[0] = '\0';
                        std::operator+(&caseName_1,&local_2e8,"compare_");
                        std::operator+(&caseName,&caseName_1,
                                       &DAT_018cf840 +
                                       *(int *)(&DAT_018cf83c + (long)(int)uVar3 * 4));
                        TestCaseGroup::TestCaseGroup
                                  (pTVar7,context,caseName._M_dataplus._M_p,
                                   glcts::fixed_sample_locations_values + 1);
                        std::__cxx11::string::~string((string *)&caseName);
                        std::__cxx11::string::~string((string *)&caseName_1);
                        std::__cxx11::string::~string((string *)&local_2e8);
                        if (pTVar7 != local_2c8) {
                          tcu::TestNode::addChild((TestNode *)local_2c8,(TestNode *)pTVar7);
                        }
                      }
                      lVar12 = 8;
                      for (lVar11 = 1; lVar11 != 4; lVar11 = lVar11 + 1) {
                        shadowCompareMode = *(CompareMode *)((long)&DAT_01e584d0 + lVar12);
                        lVar13 = lVar11;
                        if (lVar12 == 0x28) {
                          lVar13 = 0;
                        }
                        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                        local_2c0._M_string_length = 0;
                        wrapS = (&DAT_01e584d8)[lVar13 * 4];
                        local_2c0.field_2._M_local_buf[0] = '\0';
                        std::operator+(&local_2e8,&local_2c0,*(char **)(&UNK_01e584c8 + lVar12));
                        std::operator+(&caseName_1,&local_2e8,"_");
                        std::operator+(&caseName,&caseName_1,(char *)(&DAT_01e584d0)[lVar13 * 2]);
                        std::__cxx11::string::~string((string *)&caseName_1);
                        std::__cxx11::string::~string((string *)&local_2e8);
                        dVar16 = 0x136ff0c;
                        std::__cxx11::string::~string((string *)&local_2c0);
                        caseName_1._M_dataplus._M_p = (pointer)0x600000006;
                        caseName_1._M_string_length = 0x600000006;
                        caseName_1.field_2._M_local_buf[0] = '\0';
                        pTVar10 = Functional::anon_unknown_0::makeTextureGatherCase
                                            (textureType,(this->super_TestCaseGroup).m_context,
                                             caseName._M_dataplus._M_p,(char *)(ulong)uVar5,
                                             gatherType,formats[lVar8].format.order,TVar9,
                                             shadowCompareMode,wrapS,(WrapMode)&caseName_1,
                                             (MaybeTextureSwizzle *)0x0,NEAREST,NEAREST,
                                             (int)local_2a0,local_330,dVar16);
                        tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pTVar10);
                        std::__cxx11::string::~string((string *)&caseName);
                        lVar12 = lVar12 + 0x10;
                      }
                    }
LAB_0136fd67:
                    uVar3 = uVar3 + 1;
                  }
                  lVar12 = local_240 + 1;
                }
              }
              if (gatherType != GATHERTYPE_OFFSET) {
                CVar1 = formats[lVar8].format.order;
                if ((CVar1 != D) && (CVar1 != DS)) {
                  pTVar7 = (TestCaseGroup *)operator_new(0x78);
                  TestCaseGroup::TestCaseGroup
                            (pTVar7,(this->super_TestCaseGroup).m_context,"texture_swizzle",
                             glcts::fixed_sample_locations_values + 1);
                  tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pTVar7);
                  for (uVar14 = 0; uVar14 != 6; uVar14 = uVar14 + 1) {
                    swizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_R;
                    swizzle.m_swizzle.m_data[1] = TEXTURESWIZZLECOMPONENT_G;
                    swizzle.m_swizzle.m_data[2] = TEXTURESWIZZLECOMPONENT_B;
                    swizzle.m_swizzle.m_data[3] = TEXTURESWIZZLECOMPONENT_A;
                    caseName_1._M_dataplus._M_p = (pointer)&caseName_1.field_2;
                    caseName_1._M_string_length = 0;
                    swizzle.m_isSome = true;
                    caseName_1.field_2._M_local_buf[0] = '\0';
                    uVar15 = uVar14 & 0xffffffff;
                    lVar12 = 0;
                    while( true ) {
                      if (lVar12 == 0x10) break;
                      comp = (TextureSwizzleComponent)(uVar15 % 6);
                      *(TextureSwizzleComponent *)((long)swizzle.m_swizzle.m_data + lVar12) = comp;
                      __lhs = (bool *)0x1898695;
                      if (lVar12 == 0) {
                        __lhs = glcts::fixed_sample_locations_values + 1;
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseName);
                      Functional::anon_unknown_0::operator<<((ostream *)&caseName,comp);
                      std::__cxx11::stringbuf::str();
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseName);
                      de::toLower(&local_2c0,&local_288);
                      std::operator+(&local_2e8,__lhs,&local_2c0);
                      std::__cxx11::string::append((string *)&caseName_1);
                      std::__cxx11::string::~string((string *)&local_2e8);
                      std::__cxx11::string::~string((string *)&local_2c0);
                      std::__cxx11::string::~string((string *)&local_288);
                      lVar12 = lVar12 + 4;
                      uVar15 = (ulong)((int)uVar15 + 1);
                    }
                    caseName._M_dataplus._M_p = (pointer)0x4000000040;
                    caseName._M_string_length = CONCAT44(caseName._M_string_length._4_4_,3);
                    pTVar10 = Functional::anon_unknown_0::makeTextureGatherCase
                                        (textureType,(this->super_TestCaseGroup).m_context,
                                         caseName_1._M_dataplus._M_p,(char *)(ulong)uVar5,gatherType
                                         ,formats[lVar8].format.order,(TextureFormat)0x0,
                                         COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,(WrapMode)&swizzle,
                                         (MaybeTextureSwizzle *)0x0,NEAREST,NEAREST,(int)&caseName,
                                         (IVec3 *)0x0,6);
                    tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pTVar10);
                    std::__cxx11::string::~string((string *)&caseName_1);
                  }
                }
                pTVar7 = (TestCaseGroup *)operator_new(0x78);
                TestCaseGroup::TestCaseGroup
                          (pTVar7,(this->super_TestCaseGroup).m_context,"filter_mode",
                           "Test that filter modes have no effect");
                local_2a0 = pTVar7;
                tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pTVar7);
                textureFormat._1_7_ = 0;
                textureFormat.order._0_1_ = CVar1 == D || CVar1 == DS;
                CVar2 = formats[lVar8].format.type;
                uVar14 = (ulong)CVar2;
                pTVar7 = (TestCaseGroup *)0x0;
                while (pTVar7 != (TestCaseGroup *)0x5) {
                  uVar3 = (&DAT_01e58528)[(long)pTVar7 * 4];
                  local_2c8 = pTVar7;
                  for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 0x10) {
                    minFilter = *(FilterMode *)((long)&DAT_01e58508 + lVar12);
                    if ((CVar2 < UNORM_BYTE_44) && ((0x58U >> (CVar2 & UNSIGNED_INT16) & 1) != 0)) {
                      if (minFilter != NEAREST) {
LAB_013700c6:
                        if ((CVar2 < HALF_FLOAT) &&
                           ((0x2c0000000U >> ((ulong)CVar2 & 0x3f) & 1) != 0)) {
                          if ((minFilter == NEAREST) && (uVar3 == 2)) {
LAB_013700fa:
                            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                            local_288._M_string_length = 0;
                            local_288.field_2._M_local_buf[0] = '\0';
                            std::operator+(&local_2c0,&local_288,"min_");
                            std::operator+(&local_2e8,&local_2c0,
                                           (char *)(&DAT_01e58520)[(long)pTVar7 * 2]);
                            std::operator+(&caseName_1,&local_2e8,"_mag_");
                            std::operator+(&caseName,&caseName_1,
                                           *(char **)((long)&DAT_01e58500 + lVar12));
                            std::__cxx11::string::~string((string *)&caseName_1);
                            std::__cxx11::string::~string((string *)&local_2e8);
                            std::__cxx11::string::~string((string *)&local_2c0);
                            dVar16 = 0x13701b3;
                            std::__cxx11::string::~string((string *)&local_288);
                            TVar9 = formats[lVar8].format;
                            caseName_1._M_dataplus._M_p = (pointer)0x600000006;
                            caseName_1._M_string_length = 0x600000006;
                            caseName_1.field_2._M_local_buf[0] = '\0';
                            local_2e8._M_dataplus._M_p = (pointer)0x4000000040;
                            local_2e8._M_string_length =
                                 CONCAT44(local_2e8._M_string_length._4_4_,3);
                            pTVar10 = Functional::anon_unknown_0::makeTextureGatherCase
                                                (textureType,(this->super_TestCaseGroup).m_context,
                                                 caseName._M_dataplus._M_p,(char *)(ulong)uVar5,
                                                 gatherType,TVar9.order,textureFormat,
                                                 COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,
                                                 (WrapMode)&caseName_1,
                                                 (MaybeTextureSwizzle *)(ulong)uVar3,minFilter,
                                                 NEAREST,(int)&local_2e8,(IVec3 *)0x0,dVar16);
                            tcu::TestNode::addChild((TestNode *)local_2a0,(TestNode *)pTVar10);
                            uVar14 = (ulong)TVar9 >> 0x20;
                            std::__cxx11::string::~string((string *)&caseName);
                          }
                        }
                        else if ((2 < CVar2 - SIGNED_INT8) || (uVar3 == 2 && minFilter == NEAREST))
                        goto LAB_013700fa;
                      }
                    }
                    else if (CVar1 != D && CVar1 != DS || minFilter != NEAREST) goto LAB_013700c6;
                  }
                  pTVar7 = (TestCaseGroup *)
                           ((long)&(local_2c8->super_TestCaseGroup).super_TestNode._vptr_TestNode +
                           1);
                }
                pTVar7 = (TestCaseGroup *)operator_new(0x78);
                TestCaseGroup::TestCaseGroup
                          (pTVar7,(this->super_TestCaseGroup).m_context,"base_level",
                           glcts::fixed_sample_locations_values + 1);
                tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pTVar7);
                iVar4 = 1;
                while( true ) {
                  local_2c0._M_dataplus._M_p._0_4_ = iVar4;
                  if (2 < iVar4) break;
                  de::toString<int>(&caseName_1,(int *)&local_2c0);
                  std::operator+(&caseName,"level_",&caseName_1);
                  dVar16 = 0x1370305;
                  std::__cxx11::string::~string((string *)&caseName_1);
                  textureFormat_00._1_7_ = 0;
                  textureFormat_00.order._0_1_ = (formats[lVar8].format.order - D & 0xfffffffd) == 0
                  ;
                  TVar9 = formats[lVar8].format;
                  caseName_1._M_dataplus._M_p = (pointer)0x600000006;
                  caseName_1._M_string_length = 0x600000006;
                  caseName_1.field_2._M_local_buf[0] = '\0';
                  local_2e8._M_dataplus._M_p = (pointer)0x4000000040;
                  local_2e8._M_string_length = CONCAT44(local_2e8._M_string_length._4_4_,3);
                  pTVar10 = Functional::anon_unknown_0::makeTextureGatherCase
                                      (textureType,(this->super_TestCaseGroup).m_context,
                                       caseName._M_dataplus._M_p,(char *)(ulong)uVar5,gatherType,
                                       TVar9.order,textureFormat_00,COMPAREMODE_LESS_OR_EQUAL,
                                       REPEAT_GL,(WrapMode)&caseName_1,(MaybeTextureSwizzle *)0x0,
                                       NEAREST,(FilterMode)local_2c0._M_dataplus._M_p,
                                       (int)&local_2e8,(IVec3 *)0x0,dVar16);
                  tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pTVar10);
                  uVar14 = (ulong)TVar9 >> 0x20;
                  std::__cxx11::string::~string((string *)&caseName);
                  iVar4 = (int)local_2c0._M_dataplus._M_p + 1;
                }
                CVar1 = formats[lVar8].format.order;
                if ((((CVar1 != D) && (CVar1 != DS)) && (2 < (uint)uVar14 - 0x1b)) &&
                   ((0x21 < (uint)uVar14 || ((0x2c0000000U >> (uVar14 & 0x3f) & 1) == 0)))) {
                  pTVar7 = (TestCaseGroup *)operator_new(0x78);
                  TestCaseGroup::TestCaseGroup
                            (pTVar7,(this->super_TestCaseGroup).m_context,"incomplete",
                             "Test that textureGather* takes components from (0,0,0,1) for incomplete textures"
                            );
                  dVar16 = 0x1370432;
                  tcu::TestNode::addChild((TestNode *)pTVar6,(TestNode *)pTVar7);
                  caseName._M_dataplus._M_p = (pointer)0x600000006;
                  caseName._M_string_length = 0x600000006;
                  caseName.field_2._M_local_buf[0] = '\0';
                  caseName_1._M_dataplus._M_p = (pointer)0x4000000040;
                  caseName_1._M_string_length = CONCAT44(caseName_1._M_string_length._4_4_,3);
                  pTVar10 = Functional::anon_unknown_0::makeTextureGatherCase
                                      (textureType,(this->super_TestCaseGroup).m_context,
                                       "mipmap_incomplete",(char *)(ulong)uVar5,gatherType,
                                       formats[lVar8].format.order,(TextureFormat)0x0,
                                       COMPAREMODE_LESS_OR_EQUAL,REPEAT_GL,(WrapMode)&caseName,
                                       (MaybeTextureSwizzle *)0x2,NEAREST,NEAREST,(int)&caseName_1,
                                       (IVec3 *)&DAT_00000001,dVar16);
                  tcu::TestNode::addChild((TestNode *)pTVar7,(TestNode *)pTVar10);
                }
              }
              lVar8 = local_258 + 1;
            }
          }
          lVar8 = local_248 + 1;
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void TextureGatherTests::init (void)
{
	const struct
	{
		const char* name;
		TextureType type;
	} textureTypes[] =
	{
		{ "2d",			TEXTURETYPE_2D			},
		{ "2d_array",	TEXTURETYPE_2D_ARRAY	},
		{ "cube",		TEXTURETYPE_CUBE		}
	};

	const struct
	{
		const char*			name;
		tcu::TextureFormat	format;
	} formats[] =
	{
		{ "rgba8",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)		},
		{ "rgba8ui",	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8)	},
		{ "rgba8i",		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8)	},
		{ "depth32f",	tcu::TextureFormat(tcu::TextureFormat::D,		tcu::TextureFormat::FLOAT)			}
	};

	const struct
	{
		const char*		name;
		IVec3			size;
	} textureSizes[] =
	{
		{ "size_pot",	IVec3(64, 64, 3) },
		{ "size_npot",	IVec3(17, 23, 3) }
	};

	const struct
	{
		const char*				name;
		tcu::Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp_to_edge",		tcu::Sampler::CLAMP_TO_EDGE			},
		{ "repeat",				tcu::Sampler::REPEAT_GL				},
		{ "mirrored_repeat",	tcu::Sampler::MIRRORED_REPEAT_GL	}
	};

	for (int gatherTypeI = 0; gatherTypeI < GATHERTYPE_LAST; gatherTypeI++)
	{
		const GatherType		gatherType			= (GatherType)gatherTypeI;
		TestCaseGroup* const	gatherTypeGroup		= new TestCaseGroup(m_context, gatherTypeName(gatherType), gatherTypeDescription(gatherType));
		addChild(gatherTypeGroup);

		for (int offsetSizeI = 0; offsetSizeI < OFFSETSIZE_LAST; offsetSizeI++)
		{
			const OffsetSize offsetSize = (OffsetSize)offsetSizeI;
			if ((gatherType == GATHERTYPE_BASIC) != (offsetSize == OFFSETSIZE_NONE))
				continue;

			TestCaseGroup* const offsetSizeGroup = offsetSize == OFFSETSIZE_NONE ?
													gatherTypeGroup :
													new TestCaseGroup(m_context,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "min_required_offset"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "implementation_offset"
																	  : DE_NULL,
																	  offsetSize == OFFSETSIZE_MINIMUM_REQUIRED				? "Use offsets within GL minimum required range"
																	  : offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM		? "Use offsets within the implementation range"
																	  : DE_NULL);
			if (offsetSizeGroup != gatherTypeGroup)
				gatherTypeGroup->addChild(offsetSizeGroup);

			for (int textureTypeNdx = 0; textureTypeNdx < DE_LENGTH_OF_ARRAY(textureTypes); textureTypeNdx++)
			{
				const TextureType textureType = textureTypes[textureTypeNdx].type;

				if (textureType == TEXTURETYPE_CUBE && gatherType != GATHERTYPE_BASIC)
					continue;

				TestCaseGroup* const textureTypeGroup = new TestCaseGroup(m_context, textureTypes[textureTypeNdx].name, "");
				offsetSizeGroup->addChild(textureTypeGroup);

				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format			= formats[formatNdx].format;
					TestCaseGroup* const		formatGroup		= new TestCaseGroup(m_context, formats[formatNdx].name, "");
					textureTypeGroup->addChild(formatGroup);

					for (int noCornersI = 0; noCornersI <= ((textureType == TEXTURETYPE_CUBE)?1:0); noCornersI++)
					{
						const bool				noCorners		= noCornersI!= 0;
						TestCaseGroup* const	cornersGroup	= noCorners
																? new TestCaseGroup(m_context, "no_corners", "Test case variants that don't sample around cube map corners")
																: formatGroup;

						if (formatGroup != cornersGroup)
							formatGroup->addChild(cornersGroup);

						for (int textureSizeNdx = 0; textureSizeNdx < DE_LENGTH_OF_ARRAY(textureSizes); textureSizeNdx++)
						{
							const IVec3&			textureSize			= textureSizes[textureSizeNdx].size;
							TestCaseGroup* const	textureSizeGroup	= new TestCaseGroup(m_context, textureSizes[textureSizeNdx].name, "");
							cornersGroup->addChild(textureSizeGroup);

							for (int compareModeI = 0; compareModeI < tcu::Sampler::COMPAREMODE_LAST; compareModeI++)
							{
								const tcu::Sampler::CompareMode compareMode = (tcu::Sampler::CompareMode)compareModeI;

								if ((compareMode != tcu::Sampler::COMPAREMODE_NONE) != isDepthFormat(format))
									continue;

								if (compareMode != tcu::Sampler::COMPAREMODE_NONE &&
									compareMode != tcu::Sampler::COMPAREMODE_LESS &&
									compareMode != tcu::Sampler::COMPAREMODE_GREATER)
									continue;

								TestCaseGroup* const compareModeGroup = compareMode == tcu::Sampler::COMPAREMODE_NONE ?
																			textureSizeGroup :
																			new TestCaseGroup(m_context,
																							  (string() + "compare_" + compareModeName(compareMode)).c_str(),
																							  "");
								if (compareModeGroup != textureSizeGroup)
									textureSizeGroup->addChild(compareModeGroup);

								for (int wrapCaseNdx = 0; wrapCaseNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapCaseNdx++)
								{
									const int						wrapSNdx	= wrapCaseNdx;
									const int						wrapTNdx	= (wrapCaseNdx + 1) % DE_LENGTH_OF_ARRAY(wrapModes);
									const tcu::Sampler::WrapMode	wrapS		= wrapModes[wrapSNdx].mode;
									const tcu::Sampler::WrapMode	wrapT		= wrapModes[wrapTNdx].mode;

									const string caseName = string() + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

									compareModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode, wrapS, wrapT,
																					 MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, textureSize,
																					 noCorners ? GATHERCASE_DONT_SAMPLE_CUBE_CORNERS : 0));
								}
							}
						}
					}

					if (offsetSize != OFFSETSIZE_MINIMUM_REQUIRED) // Don't test all features for both offset size types, as they should be rather orthogonal.
					{
						if (!isDepthFormat(format))
						{
							TestCaseGroup* const swizzleGroup = new TestCaseGroup(m_context, "texture_swizzle", "");
							formatGroup->addChild(swizzleGroup);

							DE_STATIC_ASSERT(TEXTURESWIZZLECOMPONENT_R == 0);
							for (int swizzleCaseNdx = 0; swizzleCaseNdx < TEXTURESWIZZLECOMPONENT_LAST; swizzleCaseNdx++)
							{
								MaybeTextureSwizzle	swizzle	= MaybeTextureSwizzle::createSomeTextureSwizzle();
								string				caseName;

								for (int i = 0; i < 4; i++)
								{
									swizzle.getSwizzle()[i] = (TextureSwizzleComponent)((swizzleCaseNdx + i) % (int)TEXTURESWIZZLECOMPONENT_LAST);
									caseName += (i > 0 ? "_" : "") + de::toLower(de::toString(swizzle.getSwizzle()[i]));
								}

								swizzleGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			 tcu::Sampler::COMPAREMODE_NONE, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			 swizzle, tcu::Sampler::NEAREST, tcu::Sampler::NEAREST, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const filterModeGroup = new TestCaseGroup(m_context, "filter_mode", "Test that filter modes have no effect");
							formatGroup->addChild(filterModeGroup);

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} magFilters[] =
							{
								{ "linear",		tcu::Sampler::LINEAR	},
								{ "nearest",	tcu::Sampler::NEAREST	}
							};

							const struct
							{
								const char*					name;
								tcu::Sampler::FilterMode	filter;
							} minFilters[] =
							{
								// \note Don't test NEAREST here, as it's covered by other cases.
								{ "linear",						tcu::Sampler::LINEAR					},
								{ "nearest_mipmap_nearest",		tcu::Sampler::NEAREST_MIPMAP_NEAREST	},
								{ "nearest_mipmap_linear",		tcu::Sampler::NEAREST_MIPMAP_LINEAR		},
								{ "linear_mipmap_nearest",		tcu::Sampler::LINEAR_MIPMAP_NEAREST		},
								{ "linear_mipmap_linear",		tcu::Sampler::LINEAR_MIPMAP_LINEAR		},
							};

							for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilters); minFilterNdx++)
							for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilters); magFilterNdx++)
							{
								const tcu::Sampler::FilterMode		minFilter		= minFilters[minFilterNdx].filter;
								const tcu::Sampler::FilterMode		magFilter		= magFilters[magFilterNdx].filter;
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;

								if ((isUnormFormatType(format.type) || isDepthFormat(format)) && magFilter == tcu::Sampler::NEAREST)
									continue; // Covered by other cases.
								if ((isUIntFormatType(format.type) || isSIntFormatType(format.type)) &&
									(magFilter != tcu::Sampler::NEAREST || minFilter != tcu::Sampler::NEAREST_MIPMAP_NEAREST))
									continue;

								const string caseName = string() + "min_" + minFilters[minFilterNdx].name + "_mag_" + magFilters[magFilterNdx].name;

								filterModeGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format, compareMode,
																				tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, MaybeTextureSwizzle::createNoneTextureSwizzle(),
																				minFilter, magFilter, 0, IVec3(64, 64, 3)));
							}
						}

						{
							TestCaseGroup* const baseLevelGroup = new TestCaseGroup(m_context, "base_level", "");
							formatGroup->addChild(baseLevelGroup);

							for (int baseLevel = 1; baseLevel <= 2; baseLevel++)
							{
								const string						caseName		= "level_" + de::toString(baseLevel);
								const tcu::Sampler::CompareMode		compareMode		= isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
								baseLevelGroup->addChild(makeTextureGatherCase(textureType, m_context, caseName.c_str(), "", gatherType, offsetSize, format,
																			   compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			   MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST, tcu::Sampler::NEAREST,
																			   baseLevel, IVec3(64, 64, 3)));
							}
						}

						// What shadow textures should return for incomplete textures is unclear.
						// Integer and unsigned integer lookups from incomplete textures return undefined values.
						if (!isDepthFormat(format) && !isSIntFormatType(format.type) && !isUIntFormatType(format.type))
						{
							TestCaseGroup* const incompleteGroup = new TestCaseGroup(m_context, "incomplete", "Test that textureGather* takes components from (0,0,0,1) for incomplete textures");
							formatGroup->addChild(incompleteGroup);

							const tcu::Sampler::CompareMode compareMode = isDepthFormat(format) ? tcu::Sampler::COMPAREMODE_LESS : tcu::Sampler::COMPAREMODE_NONE;
							incompleteGroup->addChild(makeTextureGatherCase(textureType, m_context, "mipmap_incomplete", "", gatherType, offsetSize, format,
																			compareMode, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL,
																			MaybeTextureSwizzle::createNoneTextureSwizzle(), tcu::Sampler::NEAREST_MIPMAP_NEAREST, tcu::Sampler::NEAREST,
																			0, IVec3(64, 64, 3), GATHERCASE_MIPMAP_INCOMPLETE));
						}
					}
				}
			}
		}
	}
}